

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[6],char[8],char>(JObject *this,char (*k) [6],char (*v) [8],char *c)

{
  ostream *os;
  char local_40 [8];
  Field<char[6],_char[8]> field;
  
  local_40 = (char  [8])k;
  field.k = (char (*) [6])v;
  os = std::operator<<(this->os,this->sep);
  field.v = &local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[6],_char[8]>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }